

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void btSoftBody::solveClusters(btAlignedObjectArray<btSoftBody_*> *bodies)

{
  int iVar1;
  btSoftBody *pbVar2;
  Joint *pJVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  
  iVar1 = bodies->m_size;
  lVar8 = (long)iVar1;
  if (0 < lVar8) {
    lVar5 = 0;
    uVar7 = 0;
    do {
      uVar4 = (bodies->m_data[lVar5]->m_cfg).citerations;
      if ((int)uVar4 < (int)uVar7) {
        uVar4 = uVar7;
      }
      uVar7 = uVar4;
      lVar5 = lVar5 + 1;
    } while (lVar8 != lVar5);
    if (0 < iVar1) {
      lVar5 = 0;
      do {
        pbVar2 = bodies->m_data[lVar5];
        if (0 < (pbVar2->m_joints).m_size) {
          lVar9 = 0;
          do {
            pJVar3 = (pbVar2->m_joints).m_data[lVar9];
            (*pJVar3->_vptr_Joint[2])((pbVar2->m_sst).sdt,pJVar3,(ulong)uVar7);
            lVar9 = lVar9 + 1;
          } while (lVar9 < (pbVar2->m_joints).m_size);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != lVar8);
    }
    if (0 < (int)uVar7) {
      uVar4 = 0;
      do {
        if (0 < iVar1) {
          lVar5 = 0;
          do {
            pbVar2 = bodies->m_data[lVar5];
            lVar9 = (long)(pbVar2->m_joints).m_size;
            if (0 < lVar9) {
              lVar6 = 0;
              do {
                (*(pbVar2->m_joints).m_data[lVar6]->_vptr_Joint[3])((pbVar2->m_sst).sdt,0x3f800000);
                lVar6 = lVar6 + 1;
              } while (lVar9 != lVar6);
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 != lVar8);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != uVar7);
    }
    if (0 < iVar1) {
      lVar5 = 0;
      do {
        cleanupClusters(bodies->m_data[lVar5]);
        lVar5 = lVar5 + 1;
      } while (lVar8 != lVar5);
    }
  }
  return;
}

Assistant:

void			btSoftBody::solveClusters(const btAlignedObjectArray<btSoftBody*>& bodies)
{
	const int	nb=bodies.size();
	int			iterations=0;
	int i;

	for(i=0;i<nb;++i)
	{
		iterations=btMax(iterations,bodies[i]->m_cfg.citerations);
	}
	for(i=0;i<nb;++i)
	{
		bodies[i]->prepareClusters(iterations);
	}
	for(i=0;i<iterations;++i)
	{
		const btScalar sor=1;
		for(int j=0;j<nb;++j)
		{
			bodies[j]->solveClusters(sor);
		}
	}
	for(i=0;i<nb;++i)
	{
		bodies[i]->cleanupClusters();
	}
}